

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O0

boolean obj_is_local(obj *obj)

{
  obj *obj_local;
  
  switch(obj->where) {
  case '\x01':
  case '\x05':
    obj_local._7_1_ = '\x01';
    break;
  case '\x02':
    obj_local._7_1_ = obj_is_local((obj->v).v_nexthere);
    break;
  case '\x03':
  case '\a':
    obj_local._7_1_ = '\0';
    break;
  case '\x04':
    obj_local._7_1_ = mon_is_local((obj->v).v_ocarry);
    break;
  default:
    panic("obj_is_local");
  }
  return obj_local._7_1_;
}

Assistant:

boolean obj_is_local(struct obj *obj)
{
    switch (obj->where) {
	case OBJ_INVENT:
	case OBJ_MAGIC_CHEST:	return FALSE;
	case OBJ_FLOOR:
	case OBJ_BURIED:	return TRUE;
	case OBJ_CONTAINED:	return obj_is_local(obj->ocontainer);
	case OBJ_MINVENT:	return mon_is_local(obj->ocarry);
    }
    panic("obj_is_local");
    return FALSE;
}